

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * arena_malloc_hard(tsdn_t *tsdn,arena_t *arena,size_t size,szind_t ind,_Bool zero)

{
  uint ind_00;
  extent_t *slab;
  arena_t *paVar1;
  bool bVar2;
  bin_t *bin;
  void *pvVar3;
  arena_tdata_t *paVar4;
  size_t __n;
  int iVar5;
  uint local_3c;
  size_t local_38;
  
  if (arena == (arena_t *)0x0 && tsdn != (tsdn_t *)0x0) {
    if (oversize_threshold <= size) {
      paVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
      if ((paVar1 == (arena_t *)0x0) || (paVar1->base->ind < manual_arena_base)) {
        arena = arena_choose_huge(&tsdn->tsd);
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
      if (!bVar2) goto LAB_0010e85c;
    }
    arena = arena_choose(&tsdn->tsd,(arena_t *)0x0);
  }
LAB_0010e85c:
  if (arena == (arena_t *)0x0) {
    return (void *)0x0;
  }
  local_38 = sz_index2size_tab[ind];
  if (0x3800 < size) {
    pvVar3 = large_malloc(tsdn,arena,local_38,zero);
    return pvVar3;
  }
  bin = arena_bin_choose_lock(tsdn,arena,ind,&local_3c);
  slab = bin->slabcur;
  if ((slab == (extent_t *)0x0) || ((slab->e_bits & 0xffc000000) == 0)) {
    pvVar3 = arena_bin_malloc_hard(tsdn,arena,bin,ind,local_3c);
  }
  else {
    pvVar3 = arena_slab_reg_alloc(slab,bin_infos + ind);
  }
  if (pvVar3 == (void *)0x0) {
    (bin->lock).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
    return (void *)0x0;
  }
  (bin->stats).nmalloc = (bin->stats).nmalloc + 1;
  (bin->stats).nrequests = (bin->stats).nrequests + 1;
  (bin->stats).curregs = (bin->stats).curregs + 1;
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
  if (zero) {
LAB_0010e915:
    iVar5 = 0;
    __n = local_38;
  }
  else {
    if (opt_junk_alloc != true) {
      if (opt_zero != true) goto LAB_0010e958;
      goto LAB_0010e915;
    }
    __n = bin_infos[ind].reg_size;
    iVar5 = 0xa5;
  }
  memset(pvVar3,iVar5,__n);
LAB_0010e958:
  if (tsdn == (tsdn_t *)0x0) {
    return pvVar3;
  }
  ind_00 = arena->base->ind;
  paVar4 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata;
  if ((paVar4 == (arena_tdata_t *)0x0) ||
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= ind_00)) {
    paVar4 = arena_tdata_get_hard(&tsdn->tsd,ind_00);
  }
  else {
    paVar4 = paVar4 + ind_00;
  }
  if (paVar4 != (arena_tdata_t *)0x0) {
    iVar5 = (paVar4->decay_ticker).tick;
    (paVar4->decay_ticker).tick = iVar5 + -1;
    if (iVar5 < 1) {
      (paVar4->decay_ticker).tick = (paVar4->decay_ticker).nticks;
      arena_decay(tsdn,arena,false,false);
      return pvVar3;
    }
    return pvVar3;
  }
  return pvVar3;
}

Assistant:

void *
arena_malloc_hard(tsdn_t *tsdn, arena_t *arena, size_t size, szind_t ind,
    bool zero) {
	assert(!tsdn_null(tsdn) || arena != NULL);

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, size);
	}
	if (unlikely(arena == NULL)) {
		return NULL;
	}

	if (likely(size <= SC_SMALL_MAXCLASS)) {
		return arena_malloc_small(tsdn, arena, ind, zero);
	}
	return large_malloc(tsdn, arena, sz_index2size(ind), zero);
}